

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInst
          (RACFGBuilder *this,InstNode *inst,InstControlFlow *cf,RAInstBuilder *ib)

{
  InstNode IVar1;
  char cVar2;
  OpRWFlags OVar3;
  RegMask useRegMask;
  long lVar4;
  RACFGBuilder *pRVar5;
  Error EVar6;
  RATiedFlags RVar7;
  uint32_t uVar8;
  uint32_t outId;
  int iVar9;
  OpRWInfo *pOVar10;
  uint *puVar11;
  unsigned_long *puVar12;
  RATiedFlags *pRVar13;
  VirtReg **ppVVar14;
  ulong uVar15;
  RAInstBuilder *pRVar16;
  RATiedReg *pRVar17;
  Operand *pOVar18;
  Operand *pOVar19;
  RAWorkReg **ppRVar20;
  RAInstBuilder *pRVar21;
  InstNode *pIVar22;
  uint uVar23;
  RATiedFlags RVar24;
  undefined4 uVar25;
  size_t index;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  byte bVar29;
  byte bVar30;
  RATiedFlags RVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  RATiedFlags local_1b8;
  RegGroup group;
  undefined3 uStack_1b3;
  RAWorkReg *workReg;
  RATiedFlags local_1a4;
  uint local_1a0;
  uint local_19c;
  undefined8 local_198;
  RACFGBuilder *local_190;
  uint32_t local_188;
  RATiedFlags local_184;
  RAInstBuilder *local_180;
  InstNode *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  InstControlFlow *local_140;
  size_t local_138;
  InstRWInfo rwInfo;
  
  local_150 = (ulong)*(uint *)(inst + 0x30);
  if (0x6ba < local_150) {
    return 0;
  }
  IVar1 = inst[0x12];
  uVar15 = (ulong)(byte)IVar1;
  EVar6 = InstInternal::queryRWInfo
                    ((Arch)this[0x290],(BaseInst *)(inst + 0x30),(Operand_ *)(inst + 0x40),uVar15,
                     &rwInfo);
  if (EVar6 != 0) {
    return EVar6;
  }
  *(InstRWFlags *)(ib + 4) = *(InstRWFlags *)(ib + 4) | rwInfo._instFlags & ~kMovOp;
  local_180 = ib;
  local_178 = inst;
  local_160 = uVar15;
  if (IVar1 == (InstNode)0x0) {
    bVar29 = 0;
    uVar33 = 0;
    local_158 = 0;
  }
  else {
    uVar33 = *(uint *)(InstDB::_commonInfoTable +
                      (*(uint *)(InstDB::_instInfoTable + local_150 * 8) >> 0xb & 0x1ff8));
    local_184 = ~kNone;
    if ((uVar33 >> 0x17 & 1) == 0) {
      local_1b8 = kUnique|kConsecutiveData|kLeadConsecutive|kOutConsecutive|kUseConsecutive|kOutDone
                  |kUseDone|kOutFixed|kUseFixed|kOutRM|kUseRM|kOut|kUse|kRW;
      if ((uVar33 >> 0x1c & 1) != 0) {
        ib[0xb] = (RAInstBuilder)((byte)ib[0xb] | 0x80);
        local_1b8 = local_184;
      }
    }
    else {
      local_1b8 = ~kNone;
      if ((uVar33 & 0x2400000) == 0x400000) {
        if ((uVar33 >> 0x1a & 1) == 0) {
          local_1b8 = kUnique|kConsecutiveData|kLeadConsecutive|kOutConsecutive|kUseConsecutive|
                      kOutDone|kUseDone|kOutFixed|kUseFixed|kOutRM|kUseRM|kOut|kUse|kRW;
          if ((uVar33 >> 0x1b & 1) != 0) {
            local_1b8 = -(uint)(IVar1 == (InstNode)0x2) |
                        (kUnique|kConsecutiveData|kLeadConsecutive|kOutConsecutive|kUseConsecutive|
                         kOutDone|kUseDone|kOutFixed|kUseFixed|kOutRM|kUseRM|kOut|kUse|kRW);
          }
        }
        else {
          local_1b8 = -(uint)(((((Operand_ *)(inst + 0x40))->_signature)._bits & 0xff000fff) ==
                             0x289) |
                      (kUnique|kConsecutiveData|kLeadConsecutive|kOutConsecutive|kUseConsecutive|
                       kOutDone|kUseDone|kOutFixed|kUseFixed|kOutRM|kUseRM|kOut|kUse|kRW);
        }
      }
    }
    pIVar22 = inst + 0x48;
    local_148 = 0xffffffffffffffff;
    local_188 = 0;
    uVar32 = 0;
    uVar33 = 0;
    local_158 = 0;
    index = 0;
    local_190 = this;
    local_140 = cf;
    local_138 = uVar15;
    while (local_138 != index) {
      local_170 = index;
      pOVar10 = InstRWInfo::operand(&rwInfo,index);
      uVar23 = *(uint *)(pIVar22 + -8);
      uVar34 = uVar23 & 7;
      if (uVar34 == 2) {
        ib[0xc] = (RAInstBuilder)((byte)ib[0xc] | 0x30);
        if ((uVar23 >> 0xd & 1) == 0) {
          if ((8 < (uVar23 & 0xf8)) && (*(uint32_t *)(pIVar22 + -4) - 0x100 < 0xfffffeff)) {
            local_198 = pOVar10;
            EVar6 = BaseRAPass::virtIndexAsWorkReg
                              (*(BaseRAPass **)this,*(uint32_t *)(pIVar22 + -4) - 0x100,&workReg);
            pOVar10 = local_198;
            if (EVar6 != 0) {
              return EVar6;
            }
            uVar23 = local_198->_opFlags >> 0xc & 3;
            local_1a4 = *(RATiedFlags *)
                         (raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map +
                         (ulong)uVar23 * 4);
            _group = CONCAT31(uStack_1b3,workReg[0x21]) & 0xffffff0f;
            local_1a0 = uVar33;
            local_19c = uVar32;
            puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                                ((Array<unsigned_int,_4UL> *)(*(long *)this + 0x118),&group);
            local_168 = (ulong)*puVar11;
            uVar8 = InstNode::getRewriteIndex(local_178,(uint32_t *)(pIVar22 + -4));
            this = local_190;
            uVar32 = local_19c;
            uVar33 = local_1a0;
            bVar29 = (byte)uVar8 & 0x1f;
            uVar8 = 1 << bVar29;
            if ((5U >> uVar23 & 1) == 0) {
              outId = 0xff;
              uVar28 = 0;
              uVar27 = uVar8;
              if ((pOVar10->_opFlags >> 9 & 1) == 0) {
LAB_001435a5:
                uVar26 = 0xff;
                outId = 0xff;
                RVar31 = local_1a4;
                uVar8 = uVar28;
              }
              else {
                uVar26 = (uint32_t)local_198->_physId;
                RVar31 = local_1a4 | kUseFixed;
                uVar8 = uVar28;
              }
            }
            else {
              uVar26 = 0xff;
              if ((pOVar10->_opFlags >> 9 & 1) == 0) {
                uVar27 = 0 << bVar29;
                uVar28 = uVar8;
                goto LAB_001435a5;
              }
              outId = (uint32_t)local_198->_physId;
              RVar31 = local_1a4 | kOutFixed;
              uVar27 = 0 << bVar29;
            }
            EVar6 = RAInstBuilder::add(ib,workReg,RVar31,(RegMask)local_168,uVar26,uVar27,
                                       (RegMask)local_168,outId,uVar8,0,0xffffffff);
            pOVar10 = local_198;
            if (EVar6 != 0) {
              return EVar6;
            }
          }
        }
        else {
          local_198 = (OpRWInfo *)(CONCAT44(local_198._4_4_,uVar23) & 0xffffffff00000007);
          EVar6 = BaseRAPass::virtIndexAsWorkReg
                            (*(BaseRAPass **)this,*(uint32_t *)(pIVar22 + -4) - 0x100,&workReg);
          if (EVar6 != 0) {
            return EVar6;
          }
          BaseRAPass::getOrCreateStackSlot(*(BaseRAPass **)this,workReg);
          uVar34 = (uint)local_198;
        }
        if ((0x100 < (*(uint *)(pIVar22 + -8) & 0x1f00)) &&
           (*(uint32_t *)pIVar22 - 0x100 < 0xfffffeff)) {
          EVar6 = BaseRAPass::virtIndexAsWorkReg
                            (*(BaseRAPass **)this,*(uint32_t *)pIVar22 - 0x100,&workReg);
          if (EVar6 != 0) {
            return EVar6;
          }
          OVar3 = pOVar10->_opFlags;
          _group = CONCAT31(uStack_1b3,workReg[0x21]) & 0xffffff0f;
          pRVar13 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                              ((Array<unsigned_int,_4UL> *)(*(long *)local_190 + 0x118),&group);
          RVar31 = *pRVar13;
          uVar8 = InstNode::getRewriteIndex(local_178,(uint32_t *)pIVar22);
          ib = local_180;
          this = local_190;
          uVar26 = 1 << ((byte)uVar8 & 0x1f);
          uVar8 = 0;
          if ((5U >> (OVar3 >> 0xe & 3) & 1) == 0) {
            uVar8 = uVar26;
            uVar26 = 0;
          }
          EVar6 = RAInstBuilder::add(local_180,workReg,kUse|kRead,RVar31 & local_1b8,0xff,uVar8,
                                     RVar31 & local_1b8,0xff,uVar26,0,0xffffffff);
          if (EVar6 != 0) {
            return EVar6;
          }
        }
      }
      else if (uVar34 == 1) {
        OVar3 = pOVar10->_opFlags;
        RVar31 = (OVar3 & kUnique) << 8 |
                 *(RATiedFlags *)
                  (raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map +
                  (ulong)(OVar3 & (kRegMem|kRW)) * 4);
        RVar24 = local_1b8;
        if (((uVar23 & 0xff000000) == 0x1000000) && ((OVar3 & kRegPhysId) == kNone)) {
          RVar31 = RVar31 | kX86_Gpb;
          if (this[0x291] == (RACFGBuilder)0x1) {
            bVar35 = (uVar23 & 0x1000fff) == 0x1000021;
            if (bVar35) {
              RVar24 = kOut|kUse|kRW;
            }
            local_158 = CONCAT71((int7)(local_158 >> 8),(byte)local_158 | bVar35);
          }
          else {
            RVar24 = kOut|kUse|kRW;
          }
        }
        this = local_190;
        local_19c = uVar32;
        if (*(uint32_t *)(pIVar22 + -4) - 0x100 < 0xfffffeff) {
          local_198 = pOVar10;
          EVar6 = BaseRAPass::virtIndexAsWorkReg
                            (*(BaseRAPass **)local_190,*(uint32_t *)(pIVar22 + -4) - 0x100,&workReg)
          ;
          pRVar5 = local_190;
          if (EVar6 != 0) {
            return EVar6;
          }
          if (((RVar31 & kRW) == kWrite) &&
             ((*(ulong *)(workReg + 0x40) &
              ~(local_198->_extendByteMask | local_198->_writeByteMask)) != 0)) {
            RVar31 = RVar31 & ~(kOut|kUse|kRead) | (kUse|kRead);
          }
          uVar15 = (ulong)rwInfo._rmFeature;
          local_1a0 = uVar33;
          if ((rwInfo._rmFeature != '\0') && ((RVar31 & (kOutRM|kUseRM)) != kNone)) {
            _group = (uint)(rwInfo._rmFeature >> 6);
            puVar12 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                                ((Array<unsigned_long,_4UL> *)
                                 (*(long *)(*(long *)(local_190 + 8) + 0x30) + 8),(uint *)&group);
            if ((*puVar12 >> (uVar15 & 0x3f) & 1) == 0) {
              RVar31 = RVar31 & ~(kOutRM|kUseRM);
            }
          }
          _group = CONCAT31(uStack_1b3,workReg[0x21]) & 0xffffff0f;
          pRVar13 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                              ((Array<unsigned_int,_4UL> *)(*(long *)pRVar5 + 0x118),&group);
          ib = local_180;
          uVar33 = local_1a0;
          RVar24 = RVar24 & *pRVar13;
          if (local_198->_consecutiveLeadCount == 0) {
            local_168 = (ulong)RVar24;
            local_1a4 = RVar24;
          }
          else {
            if (local_184 != ~kNone) {
              return 3;
            }
            if ((RVar31 & kConsecutiveData) != kNone) {
              return 0x3c;
            }
            RVar7 = RATiedReg::consecutiveDataToFlags(local_198->_consecutiveLeadCount - 1);
            RVar31 = RVar31 | RVar7;
            local_184 = *(RATiedFlags *)workReg;
            local_168 = (ulong)(*(RATiedFlags *)
                                 (raConsecutiveLeadCountToRegMaskFilter +
                                 (ulong)local_198->_consecutiveLeadCount * 4) & RVar24);
            if ((RVar31 & kUse) == kNone) {
              RVar31 = RVar31 | (kLeadConsecutive|kOutConsecutive);
              local_1a4 = RVar24;
            }
            else {
              RVar31 = RVar31 | (kLeadConsecutive|kUseConsecutive);
              local_168 = (ulong)RVar24;
              local_1a4 = *(RATiedFlags *)
                           (raConsecutiveLeadCountToRegMaskFilter +
                           (ulong)local_198->_consecutiveLeadCount * 4) & RVar24;
            }
          }
          uVar8 = InstNode::getRewriteIndex(local_178,(uint32_t *)(pIVar22 + -4));
          bVar29 = (byte)uVar8 & 0x1f;
          uVar8 = 1 << bVar29;
          OVar3 = local_198->_opFlags;
          if ((RVar31 & kUse) == kNone) {
            uVar26 = uVar8;
            if ((OVar3 >> 8 & 1) == 0) {
              if ((OVar3 & kConsecutive) != kNone) {
                if (local_184 == ~kNone) {
                  return 3;
                }
                if (local_184 == *(RATiedFlags *)workReg) {
                  return 0x41;
                }
                local_188 = local_188 + 1;
                RVar24 = RATiedReg::consecutiveDataToFlags(local_188);
                RVar31 = RVar31 | RVar24 | kOutConsecutive;
              }
              uVar8 = 0 << bVar29;
LAB_001434eb:
              uVar28 = 0xff;
              uVar27 = 0xff;
            }
            else {
              uVar28 = (uint32_t)local_198->_physId;
              RVar31 = RVar31 | kOutFixed;
              uVar27 = 0xff;
              uVar8 = 0 << bVar29;
            }
          }
          else {
            if ((OVar3 >> 8 & 1) == 0) {
              uVar26 = 0;
              if ((OVar3 & kConsecutive) != kNone) {
                if (local_184 == ~kNone) {
                  return 3;
                }
                if (local_184 == *(RATiedFlags *)workReg) {
                  return 0x41;
                }
                local_188 = local_188 + 1;
                RVar24 = RATiedReg::consecutiveDataToFlags(local_188);
                uVar26 = 0;
                RVar31 = RVar31 | RVar24 | kUseConsecutive;
              }
              goto LAB_001434eb;
            }
            uVar27 = (uint32_t)local_198->_physId;
            RVar31 = RVar31 | kUseFixed;
            uVar28 = 0xff;
            uVar26 = 0;
          }
          EVar6 = RAInstBuilder::add(ib,workReg,RVar31,local_1a4,uVar27,uVar8,(RegMask)local_168,
                                     uVar28,uVar26,(uint)local_198->_rmSize,(uint32_t)local_148);
          if (EVar6 != 0) {
            return EVar6;
          }
          if ((RVar31 & (kLeadConsecutive|kOutConsecutive|kUseConsecutive)) != kNone) {
            local_148 = (ulong)*(uint *)workReg;
          }
          uVar33 = uVar33 + (local_170 == uVar33);
          this = local_190;
          uVar32 = local_19c;
        }
      }
      uVar32 = uVar32 | 1 << (uVar34 & 0x1f);
      pIVar22 = pIVar22 + 0x10;
      index = local_170 + 1;
    }
    bVar29 = (byte)((uVar32 & 2) >> 1);
    cf = local_140;
  }
  if (*(uint *)(local_178 + 0x38) != 0) {
    uVar32 = *(int *)(local_178 + 0x3c) - 0x100;
    if (uVar32 < 0xfffffeff) {
      EVar6 = BaseRAPass::virtIndexAsWorkReg(*(BaseRAPass **)this,uVar32,&workReg);
      if (EVar6 != 0) {
        return EVar6;
      }
      _group = CONCAT31(uStack_1b3,workReg[0x21]) & 0xffffff0f;
      puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          ((Array<unsigned_int,_4UL> *)(*(long *)this + 0x118),&group);
      useRegMask = *puVar11;
      if (group == kMask) {
        EVar6 = RAInstBuilder::add(ib,workReg,kUse|kRead,useRegMask,0xff,1,useRegMask,0xff,0,0,
                                   0xffffffff);
        if (EVar6 != 0) {
          return EVar6;
        }
        uVar33 = 0;
      }
      else {
        EVar6 = RAInstBuilder::add(ib,workReg,kUse|kRW,useRegMask,1,1,useRegMask,0xff,0,0,0xffffffff
                                  );
        if (EVar6 != 0) {
          return EVar6;
        }
      }
    }
    else if (((*(uint *)(local_178 + 0x38) & 0xf00) == 0x200) && (*(int *)(local_178 + 0x3c) != 0))
    {
      uVar33 = 0;
    }
  }
  pIVar22 = local_178;
  if (((rwInfo._instFlags & kMovOp) != kNone) && ((*(int *)(local_178 + 0x38) == 0 & bVar29) == 1))
  {
    if ((int)local_160 == 3) {
      auVar36._0_4_ = -(uint)(*(int *)(local_178 + 0x50) == *(int *)(local_178 + 0x40));
      auVar36._4_4_ = -(uint)(*(int *)(local_178 + 0x54) == *(int *)(local_178 + 0x44));
      auVar36._8_4_ = -(uint)(*(int *)(local_178 + 0x58) == *(int *)(local_178 + 0x48));
      auVar36._12_4_ = -(uint)(*(int *)(local_178 + 0x5c) == *(int *)(local_178 + 0x4c));
      iVar9 = movmskps(3,auVar36);
      if (iVar9 == 0xf) goto LAB_00143762;
    }
    else if ((int)local_160 == 2) {
LAB_00143762:
      if (*(int *)(local_178 + 0x44) - 0x100U < 0xfffffeff) {
        ppVVar14 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                             ((ZoneVector<asmjit::v1_14::VirtReg_*> *)(*(long *)(this + 8) + 0x1e8),
                              (ulong)(*(int *)(local_178 + 0x44) - 0x100U));
        uVar15 = ~rwInfo._operands[0]._writeByteMask &
                 *(ulong *)(*(long *)(*ppVVar14 + 0x28) + 0x40);
        if ((uVar15 == 0) || ((rwInfo._operands[0]._extendByteMask & uVar15) == 0)) {
          ib[4] = (RAInstBuilder)((byte)ib[4] | 1);
        }
      }
    }
  }
  if ((local_158 & 1) == 0) {
    pRVar16 = *(RAInstBuilder **)(ib + 0x38);
  }
  else {
    pRVar16 = *(RAInstBuilder **)(ib + 0x38);
    for (pRVar21 = ib + 0x40; pRVar21 != pRVar16; pRVar21 = pRVar21 + 0x20) {
      uVar25 = 0xff;
      if ((*(uint *)(pRVar21 + 8) >> 0x18 & 1) != 0) {
        uVar25 = 0xf;
      }
      *(ulong *)(pRVar21 + 0x10) = CONCAT44(uVar25,uVar25) & *(ulong *)(pRVar21 + 0x10);
    }
  }
  if (((ulong)(pRVar16 + (-0x40 - (long)ib)) & 0x1fffffffe0) != 0x20) goto LAB_001439d8;
  uVar32 = (uint)local_160;
  if (uVar33 == uVar32) {
    bVar29 = (byte)((uint)*(undefined4 *)
                           (InstDB::_commonInfoTable +
                           (ulong)(*(uint *)(InstDB::_instInfoTable + local_150 * 8) >> 0xb & 0x1ff8
                                  ) + 4) >> 0x1e);
LAB_0014383d:
    if (bVar29 == 2) {
LAB_001439c4:
      pRVar17 = RAInstBuilder::operator[](local_180,0);
      RATiedReg::makeWriteOnly(pRVar17);
      goto LAB_001439d8;
    }
    if (bVar29 != 1) goto LAB_001439d8;
  }
  else {
    if (uVar32 == 4) {
      pOVar18 = InstNode::op(pIVar22,3);
      if (((((pOVar18->super_Operand_)._signature._bits & 7) != 4) ||
          (pOVar18 = InstNode::op(pIVar22,3), (*(uint *)(pIVar22 + 0x30) & 0xfffffffe) != 0x61c)) ||
         ((cVar2 = (char)(pOVar18->super_Operand_)._data[0], cVar2 != -1 && (cVar2 != '\0'))))
      goto LAB_001439d8;
      goto LAB_001439c4;
    }
    if ((uVar32 != 2) ||
       (pOVar18 = InstNode::op(pIVar22,1), ((pOVar18->super_Operand_)._signature._bits & 7) != 4))
    goto LAB_001439d8;
    bVar30 = 0;
    pOVar18 = InstNode::op(pIVar22,0);
    pOVar19 = InstNode::op(pIVar22,1);
    lVar4 = *(long *)this;
    pRVar17 = RAInstBuilder::operator[](local_180,0);
    ppRVar20 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                         ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)(lVar4 + 0x140),
                          (ulong)pRVar17->_workId);
    iVar9 = *(int *)(pIVar22 + 0x30);
    if (((0x3f < iVar9 - 0x2b7U) ||
        (bVar29 = bVar30, (0x8000000000002003U >> ((ulong)(iVar9 - 0x2b7U) & 0x3f) & 1) == 0)) &&
       ((((bVar29 = 0, iVar9 != 9 && (bVar29 = bVar30, iVar9 != 0x17)) && (iVar9 != 0x6a8)) &&
        ((iVar9 != 0x2f9 && (iVar9 != 0x311)))))) {
      if (iVar9 != 0x1eb) goto LAB_001439d8;
      uVar33 = (pOVar18->super_Operand_)._signature._bits;
      uVar32 = uVar33 >> 0x18;
      if ((uVar33 < 0x4000000) && (uVar32 < *(uint *)(*ppRVar20 + 0x20) >> 0x18)) {
LAB_00143a68:
        bVar29 = 0;
      }
      else {
        lVar4 = *(long *)(pOVar19->super_Operand_)._data;
        if (lVar4 != -1) {
          if (0xfe < uVar32 - 1) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                       ,0x19,"size > 0 && size < 256");
          }
          uVar33 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
            }
          }
          if (lVar4 != *(long *)(raImmMaskFromSize(unsigned_int)::masks + (ulong)uVar33 * 8))
          goto LAB_00143a68;
        }
        bVar29 = 2;
      }
    }
    if ((0x4ffffff < *(uint *)(*ppRVar20 + 0x20) &&
         *(char *)((long)&(pOVar18->super_Operand_)._signature._bits + 3) == '\x04') ||
       (*(long *)(pOVar19->super_Operand_)._data != 0)) goto LAB_0014383d;
  }
  pRVar17 = RAInstBuilder::operator[](local_180,0);
  RATiedReg::makeReadOnly(pRVar17);
LAB_001439d8:
  *cf = *(uint *)(InstDB::_commonInfoTable +
                 (ulong)(*(uint *)(InstDB::_instInfoTable + local_150 * 8) >> 0xb & 0x1ff8) + 4) >>
        0x1b & (kMaxValue|kCall);
  return 0;
}

Assistant:

Error RACFGBuilder::onInst(InstNode* inst, InstControlFlow& cf, RAInstBuilder& ib) noexcept {
  InstRWInfo rwInfo;

  InstId instId = inst->id();
  if (Inst::isDefinedId(instId)) {
    uint32_t opCount = inst->opCount();
    const Operand* opArray = inst->operands();
    ASMJIT_PROPAGATE(InstInternal::queryRWInfo(_arch, inst->baseInst(), opArray, opCount, &rwInfo));

    const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
    bool hasGpbHiConstraint = false;
    uint32_t singleRegOps = 0;

    // Copy instruction RW flags to instruction builder except kMovOp, which is propagated manually later.
    ib.addInstRWFlags(rwInfo.instFlags() & ~InstRWFlags::kMovOp);

    // Mask of all operand types used by the instruction - can be used as an optimization later.
    uint32_t opTypesMask = 0u;

    if (opCount) {
      // The mask is for all registers, but we are mostly interested in AVX-512 registers at the moment. The mask
      // will be combined with all available registers of the Compiler at the end so we it never use more registers
      // than available.
      RegMask instructionAllowedRegs = 0xFFFFFFFFu;

      uint32_t consecutiveOffset = 0;
      uint32_t consecutiveLeadId = Globals::kInvalidId;
      uint32_t consecutiveParent = Globals::kInvalidId;

      if (instInfo.isEvex()) {
        // EVEX instruction and VEX instructions that can be encoded with EVEX have the possibility to use 32 SIMD
        // registers (XMM/YMM/ZMM).
        if (instInfo.isVex() && !instInfo.isEvexCompatible()) {
          if (instInfo.isEvexKRegOnly()) {
            // EVEX encodable only if the first operand is K register (compare instructions).
            if (!Reg::isKReg(opArray[0]))
              instructionAllowedRegs = 0xFFFFu;
          }
          else if (instInfo.isEvexTwoOpOnly()) {
            // EVEX encodable only if the instruction has two operands (gather instructions).
            if (opCount != 2)
              instructionAllowedRegs = 0xFFFFu;
          }
          else {
            instructionAllowedRegs = 0xFFFFu;
          }
        }
      }
      else if (instInfo.isEvexTransformable()) {
        ib.addAggregatedFlags(RATiedFlags::kInst_IsTransformable);
      }
      else {
        // Not EVEX, restrict everything to [0-15] registers.
        instructionAllowedRegs = 0xFFFFu;
      }

      for (uint32_t i = 0; i < opCount; i++) {
        const Operand& op = opArray[i];
        const OpRWInfo& opRwInfo = rwInfo.operand(i);

        opTypesMask |= 1u << uint32_t(op.opType());

        if (op.isReg()) {
          // Register Operand
          // ----------------
          const Reg& reg = op.as<Reg>();

          RATiedFlags flags = raRegRwFlags(opRwInfo.opFlags());
          RegMask allowedRegs = instructionAllowedRegs;

          if (opRwInfo.isUnique())
            flags |= RATiedFlags::kUnique;

          // X86-specific constraints related to LO|HI general purpose registers. This is only required when the
          // register is part of the encoding. If the register is fixed we won't restrict anything as it doesn't
          // restrict encoding of other registers.
          if (reg.isGpb() && !opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
            flags |= RATiedFlags::kX86_Gpb;
            if (!_is64Bit) {
              // Restrict to first four - AL|AH|BL|BH|CL|CH|DL|DH. In 32-bit mode it's not possible to access
              // SIL|DIL, etc, so this is just enough.
              allowedRegs = 0x0Fu;
            }
            else {
              // If we encountered GPB-HI register the situation is much more complicated than in 32-bit mode.
              // We need to patch all registers to not use ID higher than 7 and all GPB-LO registers to not use
              // index higher than 3. Instead of doing the patching here we just set a flag and will do it later,
              // to not complicate this loop.
              if (reg.isGpbHi()) {
                hasGpbHiConstraint = true;
                allowedRegs = 0x0Fu;
              }
            }
          }

          uint32_t vIndex = Operand::virtIdToIndex(reg.id());
          if (vIndex < Operand::kVirtIdCount) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

            // Use RW instead of Write in case that not the whole register is overwritten. This is important
            // for liveness as we cannot kill a register that will be used. For example `mov al, 0xFF` is not
            // a write-only operation if user allocated the whole `rax` register.
            if ((flags & RATiedFlags::kRW) == RATiedFlags::kWrite) {
              if (workReg->regByteMask() & ~(opRwInfo.writeByteMask() | opRwInfo.extendByteMask())) {
                // Not write-only operation.
                flags = (flags & ~RATiedFlags::kOut) | (RATiedFlags::kRead | RATiedFlags::kUse);
              }
            }

            // Do not use RegMem flag if changing Reg to Mem requires a CPU feature that is not available.
            if (rwInfo.rmFeature() && Support::test(flags, RATiedFlags::kUseRM | RATiedFlags::kOutRM)) {
              if (!cc()->code()->cpuFeatures().has(rwInfo.rmFeature())) {
                flags &= ~(RATiedFlags::kUseRM | RATiedFlags::kOutRM);
              }
            }

            RegGroup group = workReg->group();
            RegMask useRegs = _pass->_availableRegs[group] & allowedRegs;
            RegMask outRegs = useRegs;

            uint32_t useId = BaseReg::kIdBad;
            uint32_t outId = BaseReg::kIdBad;

            uint32_t useRewriteMask = 0;
            uint32_t outRewriteMask = 0;

            if (opRwInfo.consecutiveLeadCount()) {
              // There must be a single consecutive register lead, otherwise the RW data is invalid.
              if (consecutiveLeadId != Globals::kInvalidId)
                return DebugUtils::errored(kErrorInvalidState);

              // A consecutive lead register cannot be used as a consecutive +1/+2/+3 register, the registers must be distinct.
              if (RATiedReg::consecutiveDataFromFlags(flags) != 0)
                return DebugUtils::errored(kErrorNotConsecutiveRegs);

              flags |= RATiedFlags::kLeadConsecutive | RATiedReg::consecutiveDataToFlags(opRwInfo.consecutiveLeadCount() - 1);
              consecutiveLeadId = workReg->workId();

              RegMask filter = raConsecutiveLeadCountToRegMaskFilter[opRwInfo.consecutiveLeadCount()];
              if (Support::test(flags, RATiedFlags::kUse)) {
                flags |= RATiedFlags::kUseConsecutive;
                useRegs &= filter;
              }
              else {
                flags |= RATiedFlags::kOutConsecutive;
                outRegs &= filter;
              }
            }

            if (Support::test(flags, RATiedFlags::kUse)) {
              useRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                useId = opRwInfo.physId();
                flags |= RATiedFlags::kUseFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kUseConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }
            else {
              outRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                outId = opRwInfo.physId();
                flags |= RATiedFlags::kOutFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kOutConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }

            ASMJIT_PROPAGATE(ib.add(workReg, flags, useRegs, useId, useRewriteMask, outRegs, outId, outRewriteMask, opRwInfo.rmSize(), consecutiveParent));
            if (singleRegOps == i)
              singleRegOps++;

            if (Support::test(flags, RATiedFlags::kLeadConsecutive | RATiedFlags::kUseConsecutive | RATiedFlags::kOutConsecutive))
              consecutiveParent = workReg->workId();
          }
        }
        else if (op.isMem()) {
          // Memory Operand
          // --------------
          const Mem& mem = op.as<Mem>();
          ib.addForbiddenFlags(RATiedFlags::kUseRM | RATiedFlags::kOutRM);

          if (mem.isRegHome()) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(mem.baseId()), &workReg));
            _pass->getOrCreateStackSlot(workReg);
          }
          else if (mem.hasBaseReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.baseId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemBaseRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group];

              uint32_t useId = BaseReg::kIdBad;
              uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse)) {
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  useId = opRwInfo.physId();
                  flags |= RATiedFlags::kUseFixed;
                }
              }
              else {
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  outId = opRwInfo.physId();
                  flags |= RATiedFlags::kOutFixed;
                }
              }

              ASMJIT_PROPAGATE(ib.add(workReg, flags, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }

          if (mem.hasIndexReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.indexId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemIndexRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group] & instructionAllowedRegs;

              // Index registers have never fixed id on X86/x64.
              const uint32_t useId = BaseReg::kIdBad;
              const uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse))
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));
              else
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));

              ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }
        }
      }
    }

    // Handle extra operand (either REP {cx|ecx|rcx} or AVX-512 {k} selector).
    if (inst->hasExtraReg()) {
      uint32_t vIndex = Operand::virtIdToIndex(inst->extraReg().id());
      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        uint32_t rewriteMask = Support::bitMask(inst->getRewriteIndex(&inst->extraReg()._id));

        if (group == RegGroup::kX86_K) {
          // AVX-512 mask selector {k} register - read-only, allocable to any register except {k0}.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, BaseReg::kIdBad, rewriteMask, inOutRegs, BaseReg::kIdBad, 0));
          singleRegOps = 0;
        }
        else {
          // REP {cx|ecx|rcx} register - read & write, allocable to {cx|ecx|rcx} only.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRW, inOutRegs, Gp::kIdCx, rewriteMask, inOutRegs, Gp::kIdBad, 0));
        }
      }
      else {
        RegGroup group = inst->extraReg().group();
        if (group == RegGroup::kX86_K && inst->extraReg().id() != 0)
          singleRegOps = 0;
      }
    }

    // If this instruction has move semantics then check whether it could be eliminated if all virtual registers
    // are allocated into the same register. Take into account the virtual size of the destination register as that's
    // more important than a physical register size in this case.
    if (rwInfo.hasInstFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg() && Support::bitTest(opTypesMask, uint32_t(OperandType::kReg))) {
      // AVX+ move instructions have 3 operand form - the first two operands must be the same to guarantee move semantics.
      if (opCount == 2 || (opCount == 3 && opArray[0] == opArray[1])) {
        uint32_t vIndex = Operand::virtIdToIndex(opArray[0].as<Reg>().id());
        if (vIndex < Operand::kVirtIdCount) {
          const VirtReg* vReg = _cc->virtRegByIndex(vIndex);
          const OpRWInfo& opRwInfo = rwInfo.operand(0);

          uint64_t remainingByteMask = vReg->workReg()->regByteMask() & ~opRwInfo.writeByteMask();
          if (remainingByteMask == 0u || (remainingByteMask & opRwInfo.extendByteMask()) == 0)
            ib.addInstRWFlags(InstRWFlags::kMovOp);
        }
      }
    }

    // Handle X86 constraints.
    if (hasGpbHiConstraint) {
      for (RATiedReg& tiedReg : ib) {
        RegMask filter = tiedReg.hasFlag(RATiedFlags::kX86_Gpb) ? 0x0Fu : 0xFFu;
        tiedReg._useRegMask &= filter;
        tiedReg._outRegMask &= filter;
      }
    }

    if (ib.tiedRegCount() == 1) {
      // Handle special cases of some instructions where all operands share the same
      // register. In such case the single operand becomes read-only or write-only.
      InstSameRegHint sameRegHint = InstSameRegHint::kNone;
      if (singleRegOps == opCount) {
        sameRegHint = instInfo.sameRegHint();
      }
      else if (opCount == 2 && inst->op(1).isImm()) {
        // Handle some tricks used by X86 asm.
        const BaseReg& reg = inst->op(0).as<BaseReg>();
        const Imm& imm = inst->op(1).as<Imm>();

        const RAWorkReg* workReg = _pass->workRegById(ib[0]->workId());
        uint32_t workRegSize = workReg->signature().size();

        switch (inst->id()) {
          case Inst::kIdOr: {
            // Sets the value of the destination register to -1, previous content unused.
            if (reg.size() >= 4 || reg.size() >= workRegSize) {
              if (imm.value() == -1 || imm.valueAs<uint64_t>() == raImmMaskFromSize(reg.size()))
                sameRegHint = InstSameRegHint::kWO;
            }
            ASMJIT_FALLTHROUGH;
          }

          case Inst::kIdAdd:
          case Inst::kIdAnd:
          case Inst::kIdRol:
          case Inst::kIdRor:
          case Inst::kIdSar:
          case Inst::kIdShl:
          case Inst::kIdShr:
          case Inst::kIdSub:
          case Inst::kIdXor: {
            // Updates [E|R]FLAGS without changing the content.
            if (reg.size() != 4 || reg.size() >= workRegSize) {
              if (imm.value() == 0)
                sameRegHint = InstSameRegHint::kRO;
            }
            break;
          }
        }
      }
      else if (opCount == 4 && inst->op(3).isImm()) {
        const Imm& imm = inst->op(3).as<Imm>();

        switch (inst->id()) {
          case Inst::kIdVpternlogd:
          case Inst::kIdVpternlogq: {
            uint32_t predicate = uint32_t(imm.value() & 0xFFu);
            if (predicate == 0x00u || predicate == 0xFFu) {
              ib[0]->makeWriteOnly();
            }
            break;
          }
        }
      }

      switch (sameRegHint) {
        case InstSameRegHint::kNone:
          break;
        case InstSameRegHint::kRO:
          ib[0]->makeReadOnly();
          break;
        case InstSameRegHint::kWO:
          ib[0]->makeWriteOnly();
          break;
      }
    }

    cf = instInfo.controlFlow();
  }

  return kErrorOk;
}